

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall QWidgetRepaintManager::flush(QWidgetRepaintManager *this)

{
  bool bVar1;
  byte bVar2;
  QDebug *pQVar3;
  ulong uVar4;
  QPlatformTextureList *pQVar5;
  iterator o;
  QWidgetPrivate *tlw;
  QWidget *other;
  QRegion *in_RDI;
  long in_FS_OFFSET;
  QPlatformTextureList *widgetTexturesForNative;
  QWidgetPrivate *wd;
  QWidget *w;
  QList<QWidget_*> *__range1;
  QPlatformTextureList *widgetTextures;
  bool flushed;
  bool hasNeedsFlushWidgets;
  iterator __end1;
  iterator __begin1;
  QLoggingCategoryMacroHolder<(QtMsgType)4> qt_category;
  QLoggingCategory *in_stack_fffffffffffffed8;
  QWidgetPrivate *in_stack_fffffffffffffee0;
  QList<QWidget_*> *__new_val;
  QRegionData *in_stack_fffffffffffffee8;
  QMessageLogger *in_stack_fffffffffffffef0;
  QDebug *in_stack_fffffffffffffef8;
  QWidget *in_stack_ffffffffffffff08;
  QWidget *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  byte bVar6;
  QRegion *region;
  QRegion in_stack_ffffffffffffff40;
  QWidgetRepaintManager *in_stack_ffffffffffffff48;
  iterator this_00;
  iterator local_a8;
  undefined1 local_a0 [48];
  QRegion local_70;
  QRegion local_68 [5];
  QDebug local_40;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  region = in_RDI;
  QtPrivateLogging::lcWidgetPainting();
  anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)0x3a9841);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
               (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),(char *)in_stack_fffffffffffffed8,
               (char *)0x3a985a);
    QMessageLogger::info();
    pQVar3 = QDebug::operator<<(in_stack_fffffffffffffef8,in_stack_ffffffffffffff28);
    QDebug::QDebug(&local_38,pQVar3);
    ::operator<<((QDebug *)&local_30,(QRegion *)&local_38);
    pQVar3 = QDebug::operator<<(in_stack_fffffffffffffef8,in_stack_ffffffffffffff28);
    QDebug::QDebug(&local_28,pQVar3);
    ::operator<<(in_stack_fffffffffffffef8,(QList<QWidget_*> *)in_stack_fffffffffffffef0);
    QDebug::~QDebug(&local_20);
    QDebug::~QDebug(&local_28);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug(&local_38);
    QDebug::~QDebug(&local_40);
    local_10 = 0;
  }
  bVar1 = QList<QWidget_*>::isEmpty((QList<QWidget_*> *)0x3a994f);
  bVar2 = (bVar1 ^ 0xffU) & 1;
  bVar6 = 0;
  uVar4 = QRegion::isEmpty();
  if ((uVar4 & 1) == 0) {
    widgetTexturesFor(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    flush(in_stack_ffffffffffffff48,(QWidget *)in_stack_ffffffffffffff40.d,region,
          (QPlatformTextureList *)CONCAT17(bVar2,CONCAT16(bVar6,in_stack_ffffffffffffff30)));
    QRegion::QRegion(local_68);
    QRegion::operator=((QRegion *)in_stack_fffffffffffffee0,(QRegion *)in_stack_fffffffffffffed8);
    QRegion::~QRegion(local_68);
    bVar6 = 1;
  }
  if (((bVar6 & 1) == 0) && ((bVar2 & 1) == 0)) {
    QWidget::d_func((QWidget *)0x3a9a01);
    QWidgetPrivate::topData(in_stack_fffffffffffffee0);
    bVar1 = std::
            vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
            ::empty((vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
                     *)in_stack_fffffffffffffee8);
    if ((!bVar1) &&
       (pQVar5 = widgetTexturesFor(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08),
       pQVar5 != (QPlatformTextureList *)0x0)) {
      in_stack_fffffffffffffee8 = in_RDI->d;
      QRegion::QRegion(&local_70);
      flush(in_stack_ffffffffffffff48,(QWidget *)in_stack_ffffffffffffff40.d,region,
            (QPlatformTextureList *)CONCAT17(bVar2,CONCAT16(bVar6,in_stack_ffffffffffffff30)));
      QRegion::~QRegion(&local_70);
    }
  }
  if ((bVar2 & 1) != 0) {
    __new_val = (QList<QWidget_*> *)(in_RDI + 10);
    memset(local_a0,0,0x18);
    QList<QWidget_*>::QList((QList<QWidget_*> *)0x3a9aca);
    std::exchange<QList<QWidget*>,QList<QWidget*>>
              ((QList<QWidget_*> *)in_stack_fffffffffffffee8,__new_val);
    QList<QWidget_*>::~QList((QList<QWidget_*> *)0x3a9af1);
    local_a8.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_a8 = QList<QWidget_*>::begin(__new_val);
    o = QList<QWidget_*>::end(__new_val);
    while (this_00 = o, bVar1 = QList<QWidget_*>::iterator::operator!=(&local_a8,o), bVar1) {
      QList<QWidget_*>::iterator::operator*(&local_a8);
      tlw = QWidget::d_func((QWidget *)0x3a9b8b);
      if ((*(uint *)&tlw->field_0x250 >> 0x19 & 1) == 0) {
        other = (QWidget *)0x0;
      }
      else {
        other = (QWidget *)widgetTexturesFor((QWidget *)tlw,in_stack_ffffffffffffff08);
      }
      in_stack_ffffffffffffff08 = other;
      flush((QWidgetRepaintManager *)this_00.i,(QWidget *)in_stack_ffffffffffffff40.d,region,
            (QPlatformTextureList *)CONCAT17(bVar2,CONCAT16(bVar6,in_stack_ffffffffffffff30)));
      QRegion::QRegion((QRegion *)&stack0xffffffffffffff40);
      QRegion::operator=((QRegion *)__new_val,(QRegion *)other);
      QRegion::~QRegion((QRegion *)&stack0xffffffffffffff40);
      QList<QWidget_*>::iterator::operator++(&local_a8);
    }
    QList<QWidget_*>::~QList((QList<QWidget_*> *)0x3a9b67);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::flush()
{
    qCInfo(lcWidgetPainting) << "Flushing top level"
        << topLevelNeedsFlush << "and children" << needsFlushWidgets;

    const bool hasNeedsFlushWidgets = !needsFlushWidgets.isEmpty();
    bool flushed = false;

    // Flush the top level widget
    if (!topLevelNeedsFlush.isEmpty()) {
        flush(tlw, topLevelNeedsFlush, widgetTexturesFor(tlw, tlw));
        topLevelNeedsFlush = QRegion();
        flushed = true;
    }

    // Render-to-texture widgets are not in topLevelNeedsFlush so flush if we have not done it above.
    if (!flushed && !hasNeedsFlushWidgets) {
        if (!tlw->d_func()->topData()->widgetTextures.empty()) {
            if (QPlatformTextureList *widgetTextures = widgetTexturesFor(tlw, tlw))
                flush(tlw, QRegion(), widgetTextures);
        }
    }

    if (!hasNeedsFlushWidgets)
        return;

    for (QWidget *w : std::exchange(needsFlushWidgets, {})) {
        QWidgetPrivate *wd = w->d_func();
        Q_ASSERT(wd->needsFlush);
        QPlatformTextureList *widgetTexturesForNative = wd->textureChildSeen ? widgetTexturesFor(tlw, w) : nullptr;
        flush(w, *wd->needsFlush, widgetTexturesForNative);
        *wd->needsFlush = QRegion();
    }
}